

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O2

void objectContentToJson(QCborContainerPrivate *o,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  char *s;
  char *s_00;
  long idx;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d8;
  undefined1 local_c0 [24];
  QArrayDataPointer<char> local_a8;
  QCborValue local_88;
  QArrayDataPointer<char> local_70;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((o != (QCborContainerPrivate *)0x0) && ((o->elements).d.size != 0)) {
    local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_a8,(long)(indent * 4),' ');
    s = "\": ";
    if (compact) {
      s = "\":";
    }
    s_00 = ",\n";
    if (compact) {
      s_00 = ",";
    }
    idx = 0;
    do {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborContainerPrivate::valueAt((QCborValue *)local_58,o,idx);
      QByteArray::append(json,(QByteArray *)&local_a8);
      QByteArray::append(json,'\"');
      QCborContainerPrivate::valueAt(&local_88,o,idx);
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      QCborValue::toString((QString *)local_c0,&local_88,(QString *)&local_d8);
      escapedString((QByteArray *)&local_70,(QStringView)local_c0._8_16_);
      QByteArray::append(json,(QByteArray *)&local_70);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QCborValue::~QCborValue(&local_88);
      QByteArray::append(json,s);
      QCborContainerPrivate::valueAt((QCborValue *)&local_70,o,idx + 1);
      valueContentToJson((QCborValue *)&local_70,json,indent,compact);
      QCborValue::~QCborValue((QCborValue *)&local_70);
      idx = idx + 2;
      lVar1 = (o->elements).d.size;
      if (idx == lVar1) {
        if (!compact) {
          QByteArray::append(json,'\n');
        }
      }
      else {
        QByteArray::append(json,s_00);
      }
      QCborValue::~QCborValue((QCborValue *)local_58);
    } while (idx != lVar1);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void objectContentToJson(const QCborContainerPrivate *o, QByteArray &json, int indent, bool compact)
{
    if (!o || o->elements.empty())
        return;

    QByteArray indentString(4*indent, ' ');

    qsizetype i = 0;
    while (true) {
        QCborValue e = o->valueAt(i);
        json += indentString;
        json += '"';
        json += escapedString(o->valueAt(i).toString());
        json += compact ? "\":" : "\": ";
        valueContentToJson(o->valueAt(i + 1), json, indent, compact);

        if ((i += 2) == o->elements.size()) {
            if (!compact)
                json += '\n';
            break;
        }

        json += compact ? "," : ",\n";
    }
}